

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.h
# Opt level: O0

bool __thiscall
Clasp::Solver::updateOnReason(Solver *this,ConstraintScore *sc,Literal p,LitVec *lits)

{
  bool bVar1;
  uint uVar2;
  uint32 uVar3;
  uint uVar4;
  uint32 uVar5;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_RCX;
  long in_RDI;
  uint32 nLbd;
  uint32 inc;
  uint32 lbd;
  uint32 up;
  ConstraintScore *in_stack_ffffffffffffffa0;
  Solver *in_stack_ffffffffffffffa8;
  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
  *in_stack_ffffffffffffffb0;
  uint32 local_40;
  Literal in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  Literal local_8;
  bool local_1;
  
  if (in_RCX == (pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 0x180)) {
    ConstraintScore::bumpActivity(in_stack_ffffffffffffffa0);
    uVar2 = (uint)((ulong)*(undefined8 *)(in_RDI + 0x70) >> 0x27) & 3;
    if ((uVar2 != 0) &&
       (bVar1 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::empty(in_RCX),
       !bVar1)) {
      uVar3 = ConstraintScore::lbd(in_stack_ffffffffffffffa0);
      uVar4 = (uint)(uVar2 != 1);
      in_stack_ffffffffffffffb0 =
           (pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
            *)bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                        (in_RCX,0);
      in_stack_ffffffffffffffa8 =
           (Solver *)
           bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[](in_RCX,0)
      ;
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(in_RCX);
      uVar5 = countLevels((Solver *)CONCAT44(uVar2,uVar3),
                          (Literal *)CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                          (Literal *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc4.rep_);
      if (uVar5 + uVar4 < uVar3) {
        ConstraintScore::bumpLbd
                  ((ConstraintScore *)in_stack_ffffffffffffffb0,
                   (uint32)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
      }
    }
    if (((*(ulong *)(in_RDI + 0x70) >> 0x32 & 1) != 0) &&
       (bVar1 = isTrue(in_stack_ffffffffffffffa8,
                       (Literal)(uint32)((ulong)in_stack_ffffffffffffffb0 >> 0x20)), bVar1)) {
      local_40 = ConstraintScore::lbd((ConstraintScore *)(in_RDI + 0x1b0));
      std::pair<Clasp::Literal,_int>::pair<Clasp::Literal_&,_unsigned_int,_true>
                ((pair<Clasp::Literal,_int> *)&stack0xffffffffffffffc4,&local_8,&local_40);
      bk_lib::
      pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
      push_back(in_stack_ffffffffffffffb0,(pair<Clasp::Literal,_int> *)in_stack_ffffffffffffffa8);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool updateOnReason(ConstraintScore& sc, Literal p, const LitVec& lits) {
		// update only during conflict resolution
		if (&lits != &conflict_) { return false; }
		sc.bumpActivity();
		uint32 up = strategy_.updateLbd;
		if (up != SolverStrategies::lbd_fixed && !lits.empty()) {
			uint32 lbd  = sc.lbd();
			uint32 inc  = uint32(up != SolverStrategies::lbd_updated_less);
			uint32 nLbd = countLevels(&lits[0], &lits[0] + lits.size(), lbd - inc);
			if ((nLbd + inc) < lbd) {
				sc.bumpLbd(nLbd + uint32(up == SolverStrategies::lbd_update_pseudo));
			}
		}
		if (strategy_.bumpVarAct && isTrue(p)) { bumpAct_.push_back(WeightLiteral(p, sc.lbd())); }
		return true;
	}